

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instimpl.cpp
# Opt level: O2

Error asmjit::X86InstImpl::validate
                (uint32_t archType,Detail *detail,Operand_ *operands,uint32_t count)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  Error EVar7;
  byte *pbVar8;
  uint uVar9;
  Error EVar10;
  bool bVar11;
  uint uVar12;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  undefined1 *puVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint16_t uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  Operand_ *pOVar27;
  uint8_t uVar28;
  bool bVar29;
  bool bVar30;
  Operand_ *local_a0;
  OSignature oSigTranslated [6];
  
  if (2 < archType - 1) {
    return 5;
  }
  puVar16 = _x86ValidationData;
  if (archType != 1) {
    puVar16 = _x64ValidationData;
  }
  if (0x59b < (ulong)detail->instId) {
    return 3;
  }
  uVar3 = detail->options;
  lVar26 = (ulong)(*(uint *)(X86InstDB::instData + (ulong)detail->instId * 0xc) >> 0x16) * 0xc;
  uVar4 = *(uint *)(X86InstDB::commonData + lVar26);
  if ((uVar3 & 0x32000) != 0) {
    if ((uVar3 >> 0xd & 1) != 0) {
      if (count == 0) {
        return 0x1c;
      }
      if ((uVar4 & 0x4000) == 0 && (uVar3 & 0x30000) == 0) {
        return 0x1c;
      }
      if (((operands->field_0)._any.signature & 7) != 2) {
        return 0x1c;
      }
    }
    if ((uVar3 & 0x30000) != 0) {
      if ((uVar3 >> 0xd & 1) == 0) {
        return 0x1b;
      }
      if ((uVar3 & 0x30000) == 0x30000) {
        return 0x1b;
      }
      if (((uVar3 >> 0x10 & 1) != 0) && ((uVar4 & 0x8000) == 0)) {
        return 0x1d;
      }
      if (((uVar3 >> 0x11 & 1) != 0) && ((uVar4 & 0x10000) == 0)) {
        return 0x1e;
      }
    }
  }
  uVar19 = uVar3 & 0xc000;
  if (uVar19 != 0) {
    if (uVar19 == 0xc000) {
      return 0x1b;
    }
    if (((uVar3 >> 0xe & 1) != 0) && ((uVar4 & 0x1000) == 0)) {
      return 0x1f;
    }
    if (((short)uVar3 < 0) && ((uVar4 & 0x2000) == 0)) {
      return 0x1f;
    }
  }
  uVar25 = (ulong)count;
  uVar9 = 0x4032;
  if (archType != 1) {
    uVar9 = 0x4062;
  }
  uVar23 = 0xe30;
  if (archType != 1) {
    uVar23 = 0xe60;
  }
  uVar18 = 0;
  local_a0 = (Operand_ *)0x0;
  uVar14 = 0;
  uVar20 = 0;
  pOVar27 = operands;
LAB_0016db00:
  if (uVar25 == uVar18) goto LAB_0016de82;
  uVar12 = (pOVar27->field_0)._any.signature;
  EVar7 = 4;
  switch(uVar12 & 7) {
  case 0:
    uVar9 = count - 1;
    uVar25 = (ulong)uVar9;
    if ((uint)uVar18 < uVar9) {
      uVar25 = uVar18 & 0xffffffff;
    }
    while ((uint)uVar18 < uVar9) {
      uVar17 = (ulong)uVar9;
      uVar9 = uVar9 - 1;
      if ((undefined1  [16])((undefined1  [16])operands[uVar17].field_0 & (undefined1  [16])0x7) !=
          (undefined1  [16])0x0) {
        return 4;
      }
    }
LAB_0016de82:
    if (archType == 1) {
      if ((uVar20 & 0x10) != 0) {
        return 0x32;
      }
    }
    else if (((uVar20 & 2) != 0) && (0xff < uVar14)) {
      return 0x31;
    }
    uVar18 = *(ulong *)(X86InstDB::commonData + lVar26 + 4) >> 0x32;
    uVar9 = (uint)uVar25;
    if ((uVar18 & 0xf) == 0) {
LAB_0016e0a1:
      uVar23 = (detail->extraReg)._signature;
      if ((uVar3 & 0x9c0000) == 0 && uVar23 == 0) {
        return 0;
      }
      if ((uVar4 >> 0x14 & 1) != 0) {
        if (uVar23 != 0) {
          if ((uVar23 & 0xf8) != 0x90) {
            return 0x21;
          }
          if ((uVar4 >> 0x18 & 1) == 0) {
            return 0x22;
          }
        }
        if (((uVar3 >> 0x17 & 1) != 0) && ((uVar4 & 0x2000000) == 0)) {
          return 0x23;
        }
        if ((uVar3 >> 0x14 & 1) != 0) {
          if (local_a0 == (Operand_ *)0x0) {
            return 0x24;
          }
          uVar19 = (local_a0->field_0)._any.signature;
          if (0xffffff < uVar19) {
            uVar19 = uVar19 >> 0x18;
            if (((uVar4 >> 0x1c & 1) != 0) && (uVar19 != 4)) {
              return 0x24;
            }
            if (((uVar4 >> 0x1d & 1) != 0) && (uVar19 != 8)) {
              return 0x24;
            }
          }
        }
        if ((uVar3 & 0xc0000) == 0) {
          return 0;
        }
        if (local_a0 == (Operand_ *)0x0) {
          if ((uVar3 >> 0x12 & 1) == 0) {
            if ((uVar4 >> 0x1b & 1) != 0) {
              return 0;
            }
          }
          else if ((uVar4 >> 0x1a & 1) != 0) {
            if ((uVar4 & 0x30000000) == 0) {
              return 0;
            }
            if (uVar9 < 2) {
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/x86/x86instimpl.cpp"
                         ,0x23f,"count >= 2");
            }
            if ((operands->field_0)._any.signature == 0x40000159) {
              return 0;
            }
            if (operands[1].field_0._any.signature != 0x40000159) {
              return 0x25;
            }
            return 0;
          }
        }
        return 0x25;
      }
      EVar10 = 0x16;
      EVar7 = 0;
      if (uVar19 == 0) {
        EVar7 = EVar10;
      }
      bVar30 = (uVar3 & 0x9c0000) == 0;
    }
    else {
      pbVar8 = X86InstDB::iSignatureData +
               (ulong)((uint)(*(ulong *)(X86InstDB::commonData + lVar26 + 4) >> 0x28) & 0x3ff) * 8;
      pbVar1 = pbVar8 + (uVar18 & 0xf) * 8;
      bVar11 = false;
      bVar30 = false;
      do {
        bVar2 = *pbVar8;
        if ((byte)(bVar2 >> 3 & (archType != 1) + 1U) != 0) {
          uVar23 = bVar2 & 7;
          if (uVar9 == uVar23) {
            bVar6 = false;
            for (uVar17 = 0; uVar18 = uVar25, uVar25 != uVar17; uVar17 = uVar17 + 1) {
              uVar24 = (ulong)pbVar8[uVar17 + 2];
              uVar23 = oSigTranslated[uVar17].flags;
              uVar18 = uVar17;
              if ((*(uint *)(X86InstDB::oSignatureData + uVar24 * 8) & uVar23) == 0) {
                if (((uVar23 & 0x7fc0000) == 0) ||
                   (bVar30 = true,
                   (*(uint *)(X86InstDB::oSignatureData + uVar24 * 8) & 0x7fc0000) == 0)) break;
              }
              else {
                uVar13 = oSigTranslated[uVar17].memFlags;
                if (((uVar13 != 0) &&
                    (((*(ushort *)(X86InstDB::oSignatureData + uVar24 * 8 + 4) & uVar13) == 0 ||
                     (((uVar13 >> 0xb & 1) == 0 &&
                      ((*(ushort *)(X86InstDB::oSignatureData + uVar24 * 8 + 4) & 0x800) != 0))))))
                   || ((bVar30 = bVar6, (uVar23 & 0x7fff) != 0 &&
                       ((X86InstDB::oSignatureData[uVar24 * 8 + 7] != 0 &&
                        ((oSigTranslated[uVar17].regMask & X86InstDB::oSignatureData[uVar24 * 8 + 7]
                         ) == 0)))))) break;
              }
              bVar6 = bVar30;
            }
          }
          else {
            bVar6 = false;
            uVar18 = 0;
            if (uVar23 - (bVar2 >> 5) == uVar9) {
              uVar18 = 0;
              bVar6 = false;
              uVar14 = 0;
              while ((uVar18 < uVar25 && (uVar14 < uVar23))) {
                uVar17 = (ulong)uVar14;
                while( true ) {
                  uVar24 = (ulong)pbVar8[uVar17 + 2];
                  uVar14 = *(uint *)(X86InstDB::oSignatureData + uVar24 * 8);
                  if (-1 < (int)uVar14) break;
                  uVar17 = uVar17 + 1;
                  if (uVar23 <= (uint)uVar17) goto LAB_0016e069;
                }
                uVar20 = oSigTranslated[uVar18].flags;
                if ((uVar20 & uVar14) == 0) {
                  if (((uVar14 & 0x7fc0000) == 0) || (bVar30 = true, (uVar20 & 0x7fc0000) == 0))
                  break;
                }
                else {
                  uVar13 = oSigTranslated[uVar18].memFlags;
                  if (((uVar13 != 0) &&
                      (((*(ushort *)(X86InstDB::oSignatureData + uVar24 * 8 + 4) & uVar13) == 0 ||
                       (((uVar13 >> 0xb & 1) == 0 &&
                        ((*(ushort *)(X86InstDB::oSignatureData + uVar24 * 8 + 4) & 0x800) != 0)))))
                      ) || ((bVar30 = bVar6, (uVar20 & 0x7fff) != 0 &&
                            ((X86InstDB::oSignatureData[uVar24 * 8 + 7] != 0 &&
                             ((oSigTranslated[uVar18].regMask &
                              X86InstDB::oSignatureData[uVar24 * 8 + 7]) == 0)))))) break;
                }
                bVar6 = bVar30;
                uVar18 = uVar18 + 1;
                uVar14 = (int)uVar17 + 1;
              }
            }
          }
LAB_0016e069:
          bVar29 = (uint)uVar18 == uVar9;
          bVar30 = bVar11;
          if (bVar29) {
            bVar30 = bVar6;
          }
          bVar11 = bVar30;
          if (bVar6 || !bVar29) goto LAB_0016e084;
          if (pbVar8 != pbVar1) goto LAB_0016e0a1;
          break;
        }
LAB_0016e084:
        pbVar8 = pbVar8 + 8;
      } while (pbVar8 != pbVar1);
      bVar30 = !bVar30;
      EVar10 = 0x2c;
      EVar7 = 0x16;
    }
    if (!bVar30) {
      EVar7 = EVar10;
    }
switchD_0016db24_default:
    return EVar7;
  case 1:
    uVar12 = uVar12 >> 3 & 0x1f;
    if ((0x15 < uVar12) ||
       (uVar15 = *(uint *)(_x86OpFlagFromRegType + (ulong)uVar12 * 4), uVar15 == 0)) {
      return 0x17;
    }
    uVar22 = (pOVar27->field_0)._any.id;
    if (0xff < uVar22) {
      uVar21 = 0;
      uVar28 = 0xff;
      goto LAB_0016dde6;
    }
    if ((0x1f < uVar22) || ((*(uint *)(puVar16 + (ulong)uVar12 * 4) >> (uVar22 & 0x1f) & 1) == 0)) {
      return 0x19;
    }
    uVar12 = 1 << (uVar22 & 0x1f);
    uVar14 = uVar14 | uVar12;
    goto LAB_0016dbb1;
  case 2:
    if ((~uVar12 & 0xe00000) == 0) {
      return 0x2b;
    }
    uVar22 = uVar12 >> 3 & 0x1f;
    uVar15 = uVar12 >> 8 & 0x1f;
    if (uVar22 == 0) {
      if ((archType == 1) && (2 < (pOVar27->field_0)._mem.field_2.offset64 + 0x80000000 >> 0x1f)) {
        return 0x26;
      }
      if (uVar15 == 0) {
        uVar15 = 0x10000;
        uVar28 = '\0';
        uVar13 = 0;
      }
      else {
LAB_0016dc9f:
        if ((uVar23 >> (uVar12 >> 8 & 0x1f) & 1) == 0) {
          return 0x26;
        }
        if (uVar15 - 9 < 3) {
          if (uVar22 == 0xe) {
            return 0x26;
          }
          uVar13 = (ushort)(0x4400220011 >> ((ulong)((uVar15 - 9) * 0x10) & 0x3f));
          uVar15 = 0x20000;
        }
        else {
          uVar15 = 0x10000;
          uVar13 = (ushort)(uVar22 != 0) << 0xe;
        }
        uVar22 = (pOVar27->field_0)._any.id;
        uVar28 = '\0';
        if (uVar22 < 0x100) {
          if (0x1f < uVar22) {
LAB_0016e1f9:
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/x86/../base/utils.h"
                       ,0x13e,"x < 32");
          }
          uVar14 = uVar14 | 1 << (uVar22 & 0x1f);
        }
      }
    }
    else {
      uVar5 = (pOVar27->field_0)._any.reserved12_4;
      if (((uVar12 >> 0x10 & 1) == 0) && ((uVar9 >> (uVar12 >> 3 & 0x1f) & 1) == 0)) {
        return 0x26;
      }
      if (uVar5 < 0x100) {
        if (0x1f < uVar5) goto LAB_0016e1f9;
        uVar14 = uVar14 | 1 << (uVar5 & 0x1f);
        uVar28 = (uint8_t)(1 << (uVar5 & 0x1f));
      }
      else {
        uVar28 = 0xff;
      }
      if (uVar15 != 0) goto LAB_0016dc9f;
      uVar15 = 0x10000;
      uVar13 = (ushort)((pOVar27->field_0)._any.reserved8_4 == 0) << 0xb;
    }
    uVar12 = uVar12 >> 0x18;
    local_a0 = pOVar27;
    switch(uVar12) {
    case 0:
      uVar21 = uVar13 | 0x8000;
      break;
    case 1:
      uVar21 = uVar13 | 1;
      break;
    case 2:
      uVar21 = uVar13 | 2;
      break;
    case 3:
    case 5:
    case 7:
    case 9:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
      return 0x2d;
    case 4:
      uVar21 = uVar13 | 4;
      break;
    case 6:
      uVar21 = uVar13 | 8;
      break;
    case 8:
      uVar21 = uVar13 | 0x10;
      break;
    case 10:
      uVar21 = uVar13 | 0x20;
      break;
    case 0x10:
      uVar21 = uVar13 | 0x40;
      break;
    default:
      if (uVar12 == 0x20) {
        uVar21 = uVar13 | 0x80;
      }
      else {
        if (uVar12 != 0x40) {
          return 0x2d;
        }
        uVar21 = uVar13 | 0x100;
      }
    }
    goto LAB_0016dde6;
  case 3:
    uVar17 = *(ulong *)((long)&pOVar27->field_0 + 8);
    if ((long)uVar17 < 0) {
      uVar17 = -uVar17;
      if (uVar17 < 0x81) {
        uVar15 = 0x2a80000;
      }
      else if (uVar17 < 0x8001) {
        uVar15 = 0x2a00000;
      }
      else {
        uVar15 = (uVar17 < 0x80000001 | 4) << 0x17;
      }
    }
    else if (uVar17 < 0x10) {
      uVar15 = 0x7fc0000;
    }
    else if (uVar17 < 0x80) {
      uVar15 = 0x7f80000;
    }
    else if (uVar17 < 0x100) {
      uVar15 = 0x7f00000;
    }
    else if (uVar17 < 0x8000) {
      uVar15 = 0x7e00000;
    }
    else if (uVar17 < 0x10000) {
      uVar15 = 0x7c00000;
    }
    else if (uVar17 >> 0x1f == 0) {
      uVar15 = 0x7800000;
    }
    else {
      uVar15 = (uVar17 >> 0x20 == 0 | 6) << 0x18;
    }
    break;
  case 4:
    uVar15 = 0x18000000;
    break;
  default:
    goto switchD_0016db24_default;
  }
  uVar12 = 0;
LAB_0016dbb1:
  uVar28 = (uint8_t)uVar12;
  uVar21 = 0;
LAB_0016dde6:
  oSigTranslated[uVar18].flags = uVar15;
  oSigTranslated[uVar18].memFlags = uVar21;
  oSigTranslated[uVar18].regMask = uVar28;
  uVar20 = uVar20 | uVar15;
  uVar18 = uVar18 + 1;
  pOVar27 = pOVar27 + 1;
  goto LAB_0016db00;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86InstImpl::validate(uint32_t archType, const Inst::Detail& detail, const Operand_* operands, uint32_t count) noexcept {
  uint32_t i;
  uint32_t archMask;
  const X86ValidationData* vd;

  if (!ArchInfo::isX86Family(archType))
    return DebugUtils::errored(kErrorInvalidArch);

  if (archType == ArchInfo::kTypeX86) {
    vd = &_x86ValidationData;
    archMask = X86Inst::kArchMaskX86;
  }
  else {
    vd = &_x64ValidationData;
    archMask = X86Inst::kArchMaskX64;
  }

  // Get the instruction data.
  uint32_t instId = detail.instId;
  uint32_t options = detail.options;

  if (ASMJIT_UNLIKELY(instId >= X86Inst::_kIdCount))
    return DebugUtils::errored(kErrorInvalidArgument);

  const X86Inst* iData = &X86InstDB::instData[instId];
  uint32_t iFlags = iData->getFlags();

  // Validate LOCK, XACQUIRE, and XRELEASE prefixes.
  const uint32_t kLockXAcqRel = X86Inst::kOptionXAcquire | X86Inst::kOptionXRelease;
  if (options & (X86Inst::kOptionLock | kLockXAcqRel)) {
    if (options & X86Inst::kOptionLock) {
      if (ASMJIT_UNLIKELY(!(iFlags & X86Inst::kFlagLock) && !(options & kLockXAcqRel)))
        return DebugUtils::errored(kErrorInvalidLockPrefix);

      if (ASMJIT_UNLIKELY(count < 1 || !operands[0].isMem()))
        return DebugUtils::errored(kErrorInvalidLockPrefix);
    }

    if (options & kLockXAcqRel) {
      if (ASMJIT_UNLIKELY(!(options & X86Inst::kOptionLock) || (options & kLockXAcqRel) == kLockXAcqRel))
        return DebugUtils::errored(kErrorInvalidPrefixCombination);

      if (ASMJIT_UNLIKELY((options & X86Inst::kOptionXAcquire) && !(iFlags & X86Inst::kFlagXAcquire)))
        return DebugUtils::errored(kErrorInvalidXAcquirePrefix);

      if (ASMJIT_UNLIKELY((options & X86Inst::kOptionXRelease) && !(iFlags & X86Inst::kFlagXRelease)))
        return DebugUtils::errored(kErrorInvalidXReleasePrefix);
    }
  }

  // Validate REP and REPNZ prefixes.
  const uint32_t kRepRepRepnz = X86Inst::kOptionRep | X86Inst::kOptionRepnz;
  if (options & kRepRepRepnz) {
    if (ASMJIT_UNLIKELY((options & kRepRepRepnz) == kRepRepRepnz))
      return DebugUtils::errored(kErrorInvalidPrefixCombination);

    if (ASMJIT_UNLIKELY((options & X86Inst::kOptionRep) && !(iFlags & X86Inst::kFlagRep)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);

    if (ASMJIT_UNLIKELY((options & X86Inst::kOptionRepnz) && !(iFlags & X86Inst::kFlagRepnz)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);

    // TODO: Validate extraReg {cx|ecx|rcx}.
  }

  // Translate the given operands to `X86Inst::OSignature`.
  X86Inst::OSignature oSigTranslated[6];
  uint32_t combinedOpFlags = 0;
  uint32_t combinedRegMask = 0;

  const X86Mem* memOp = nullptr;

  for (i = 0; i < count; i++) {
    const Operand_& op = operands[i];
    if (op.getOp() == Operand::kOpNone) break;

    uint32_t opFlags = 0;
    uint32_t memFlags = 0;
    uint32_t regMask = 0;

    switch (op.getOp()) {
      case Operand::kOpReg: {
        uint32_t regType = op.as<Reg>().getType();
        if (ASMJIT_UNLIKELY(regType >= X86Reg::kRegCount))
          return DebugUtils::errored(kErrorInvalidRegType);

        opFlags = _x86OpFlagFromRegType[regType];
        if (ASMJIT_UNLIKELY(opFlags == 0))
          return DebugUtils::errored(kErrorInvalidRegType);

        // If `regId` is equal or greater than Operand::kPackedIdMin it means
        // that the register is virtual and its index will be assigned later
        // by the register allocator. We must pass unless asked to disallow
        // virtual registers.
        // TODO: We need an option to refuse virtual regs here.
        uint32_t regId = op.getId();
        if (regId < Operand::kPackedIdMin) {
          if (ASMJIT_UNLIKELY(regId >= 32))
            return DebugUtils::errored(kErrorInvalidPhysId);

          regMask = Utils::mask(regId);
          if (ASMJIT_UNLIKELY((vd->allowedRegMask[regType] & regMask) == 0))
            return DebugUtils::errored(kErrorInvalidPhysId);

          combinedRegMask |= regMask;
        }
        else {
          regMask = 0xFFFFFFFFU;
        }
        break;
      }

      // TODO: Validate base and index and combine with `combinedRegMask`.
      case Operand::kOpMem: {
        const X86Mem& m = op.as<X86Mem>();

        uint32_t baseType = m.getBaseType();
        uint32_t indexType = m.getIndexType();

        memOp = &m;

        if (m.getSegmentId() > 6)
          return DebugUtils::errored(kErrorInvalidSegment);

        if (baseType) {
          uint32_t baseId = m.getBaseId();

          if (m.isRegHome()) {
            // Home address of virtual register. In such case we don't want to
            // validate the type of the base register as it will always be patched
            // to ESP|RSP.
          }
          else {
            if (ASMJIT_UNLIKELY((vd->allowedMemBaseRegs & (1U << baseType)) == 0))
              return DebugUtils::errored(kErrorInvalidAddress);
          }

          // Create information that will be validated only if this is an implicit
          // memory operand. Basically only usable for string instructions and other
          // instructions where memory operand is implicit and has 'seg:[reg]' form.
          if (baseId < Operand::kPackedIdMin) {
            // Physical base id.
            regMask = Utils::mask(baseId);
            combinedRegMask |= regMask;
          }
          else {
            // Virtual base id - will the whole mask for implicit mem validation.
            // The register is not assigned yet, so we cannot predict the phys id.
            regMask = 0xFFFFFFFFU;
          }

          if (!indexType && !m.getOffsetLo32())
            memFlags |= X86Inst::kMemOpBaseOnly;
        }
        else {
          // Base is an address, make sure that the address doesn't overflow 32-bit
          // integer (either int32_t or uint32_t) in 32-bit targets.
          int64_t offset = m.getOffset();
          if (archMask == X86Inst::kArchMaskX86 && !Utils::isInt32(offset) && !Utils::isUInt32(offset))
            return DebugUtils::errored(kErrorInvalidAddress);
        }

        if (indexType) {
          if (ASMJIT_UNLIKELY((vd->allowedMemIndexRegs & (1U << indexType)) == 0))
            return DebugUtils::errored(kErrorInvalidAddress);

          if (indexType == X86Reg::kRegXmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32x | X86Inst::kMemOpVm64x;
          }
          else if (indexType == X86Reg::kRegYmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32y | X86Inst::kMemOpVm64y;
          }
          else if (indexType == X86Reg::kRegZmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32z | X86Inst::kMemOpVm64z;
          }
          else {
            opFlags |= X86Inst::kOpMem;
            if (baseType)
              memFlags |= X86Inst::kMemOpMib;
          }

          // [RIP + {XMM|YMM|ZMM}] is not allowed.
          if (baseType == X86Reg::kRegRip && (opFlags & X86Inst::kOpVm))
            return DebugUtils::errored(kErrorInvalidAddress);

          uint32_t indexId = m.getIndexId();
          if (indexId < Operand::kPackedIdMin)
            combinedRegMask |= Utils::mask(indexId);

          // Only used for implicit memory operands having 'seg:[reg]' form, so clear it.
          regMask = 0;
        }
        else {
          opFlags |= X86Inst::kOpMem;
        }

        switch (m.getSize()) {
          case  0: memFlags |= X86Inst::kMemOpAny ; break;
          case  1: memFlags |= X86Inst::kMemOpM8  ; break;
          case  2: memFlags |= X86Inst::kMemOpM16 ; break;
          case  4: memFlags |= X86Inst::kMemOpM32 ; break;
          case  6: memFlags |= X86Inst::kMemOpM48 ; break;
          case  8: memFlags |= X86Inst::kMemOpM64 ; break;
          case 10: memFlags |= X86Inst::kMemOpM80 ; break;
          case 16: memFlags |= X86Inst::kMemOpM128; break;
          case 32: memFlags |= X86Inst::kMemOpM256; break;
          case 64: memFlags |= X86Inst::kMemOpM512; break;
          default:
            return DebugUtils::errored(kErrorInvalidOperandSize);
        }

        break;
      }

      case Operand::kOpImm: {
        uint64_t immValue = op.as<Imm>().getUInt64();
        uint32_t immFlags = 0;

        if (static_cast<int64_t>(immValue) >= 0) {
          const uint32_t k32AndMore = X86Inst::kOpI32 | X86Inst::kOpU32 |
                                      X86Inst::kOpI64 | X86Inst::kOpU64 ;

          if (immValue <= 0xFU)
            immFlags = X86Inst::kOpU4 | X86Inst::kOpI8 | X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FU)
            immFlags = X86Inst::kOpI8 | X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0xFFU)
            immFlags = X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FFFU)
            immFlags = X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0xFFFFU)
            immFlags = X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FFFFFFFU)
            immFlags = k32AndMore;
          else if (immValue <= 0xFFFFFFFFU)
            immFlags = X86Inst::kOpU32 | X86Inst::kOpI64 | X86Inst::kOpU64;
          else if (immValue <= ASMJIT_UINT64_C(0x7FFFFFFFFFFFFFFF))
            immFlags = X86Inst::kOpI64 | X86Inst::kOpU64;
          else
            immFlags = X86Inst::kOpU64;
        }
        else {
          // 2s complement negation, as our number is unsigned...
          immValue = (~immValue + 1);

          if (immValue <= 0x80U)
            immFlags = X86Inst::kOpI8 | X86Inst::kOpI16 | X86Inst::kOpI32 | X86Inst::kOpI64;
          else if (immValue <= 0x8000U)
            immFlags = X86Inst::kOpI16 | X86Inst::kOpI32 | X86Inst::kOpI64;
          else if (immValue <= 0x80000000U)
            immFlags = X86Inst::kOpI32 | X86Inst::kOpI64;
          else
            immFlags = X86Inst::kOpI64;
        }
        opFlags |= immFlags;
        break;
      }

      case Operand::kOpLabel: {
        opFlags |= X86Inst::kOpRel8 | X86Inst::kOpRel32;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    X86Inst::OSignature& tod = oSigTranslated[i];
    tod.flags = opFlags;
    tod.memFlags = static_cast<uint16_t>(memFlags);
    tod.regMask = static_cast<uint8_t>(regMask & 0xFFU);
    combinedOpFlags |= opFlags;
  }

  // Decrease the number of operands of those that are none. This is important
  // as Assembler and CodeCompiler may just pass more operands where some of
  // them are none (it means that no operand is given at that index). However,
  // validate that there are no gaps (like [reg, none, reg] or [none, reg]).
  if (i < count) {
    while (--count > i)
      if (ASMJIT_UNLIKELY(!operands[count].isNone()))
        return DebugUtils::errored(kErrorInvalidState);
  }

  // Validate X86 and X64 specific cases.
  if (archMask == X86Inst::kArchMaskX86) {
    // Illegal use of 64-bit register in 32-bit mode.
    if (ASMJIT_UNLIKELY((combinedOpFlags & X86Inst::kOpGpq) != 0))
      return DebugUtils::errored(kErrorInvalidUseOfGpq);
  }
  else {
    // Illegal use of a high 8-bit register with REX prefix.
    if (ASMJIT_UNLIKELY((combinedOpFlags & X86Inst::kOpGpbHi) != 0 && (combinedRegMask & 0xFFFFFF00U) != 0))
      return DebugUtils::errored(kErrorInvalidUseOfGpbHi);
  }

  // Validate instruction operands.
  const X86Inst::CommonData* commonData = &iData->getCommonData();
  const X86Inst::ISignature* iSig = X86InstDB::iSignatureData + commonData->_iSignatureIndex;
  const X86Inst::ISignature* iEnd = iSig                      + commonData->_iSignatureCount;

  if (iSig != iEnd) {
    const X86Inst::OSignature* oSigData = X86InstDB::oSignatureData;

    // If set it means that we matched a signature where only immediate value
    // was out of bounds. We can return a more descriptive error if we know this.
    bool globalImmOutOfRange = false;

    do {
      // Check if the architecture is compatible.
      if ((iSig->archMask & archMask) == 0) continue;

      // Compare the operands table with reference operands.
      uint32_t j = 0;
      uint32_t iSigCount = iSig->opCount;
      bool localImmOutOfRange = false;

      if (iSigCount == count) {
        for (j = 0; j < count; j++)
          if (!x86CheckOSig(oSigTranslated[j], oSigData[iSig->operands[j]], localImmOutOfRange))
            break;
      }
      else if (iSigCount - iSig->implicit == count) {
        uint32_t r = 0;
        for (j = 0; j < count && r < iSigCount; j++, r++) {
          const X86Inst::OSignature* oChk = oSigTranslated + j;
          const X86Inst::OSignature* oRef;
Next:
          oRef = oSigData + iSig->operands[r];
          // Skip implicit.
          if ((oRef->flags & X86Inst::kOpImplicit) != 0) {
            if (++r >= iSigCount)
              break;
            else
              goto Next;
          }

          if (!x86CheckOSig(*oChk, *oRef, localImmOutOfRange))
            break;
        }
      }

      if (j == count) {
        if (!localImmOutOfRange) {
          // Match, must clear possible `globalImmOutOfRange`.
          globalImmOutOfRange = false;
          break;
        }
        globalImmOutOfRange = localImmOutOfRange;
      }
    } while (++iSig != iEnd);

    if (iSig == iEnd) {
      if (globalImmOutOfRange)
        return DebugUtils::errored(kErrorInvalidImmediate);
      else
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate AVX-512 options:
  const RegOnly& extraReg = detail.extraReg;
  const uint32_t kAvx512Options = X86Inst::kOptionZMask   |
                                  X86Inst::kOption1ToX    |
                                  X86Inst::kOptionER      |
                                  X86Inst::kOptionSAE     ;

  if (!extraReg.isNone() || (options & kAvx512Options)) {
    if (commonData->hasFlag(X86Inst::kFlagEvex)) {
      // Validate AVX-512 {k} and {k}{z}.
      if (!extraReg.isNone()) {
        // Mask can only be specified by a 'k' register.
        if (ASMJIT_UNLIKELY(extraReg.getType() != X86Reg::kRegK))
          return DebugUtils::errored(kErrorInvalidKMaskReg);

        if (ASMJIT_UNLIKELY(!commonData->hasAvx512K()))
          return DebugUtils::errored(kErrorInvalidKMaskUse);
      }

      if ((options & X86Inst::kOptionZMask)) {
        if (ASMJIT_UNLIKELY((options & X86Inst::kOptionZMask) != 0 && !commonData->hasAvx512Z()))
          return DebugUtils::errored(kErrorInvalidKZeroUse);
      }

      // Validate AVX-512 broadcast {1tox}.
      if (options & X86Inst::kOption1ToX) {
        if (ASMJIT_UNLIKELY(!memOp))
          return DebugUtils::errored(kErrorInvalidBroadcast);

        uint32_t size = memOp->getSize();
        if (size != 0) {
          // The the size is specified it has to match the broadcast size.
          if (ASMJIT_UNLIKELY(commonData->hasAvx512B32() && size != 4))
            return DebugUtils::errored(kErrorInvalidBroadcast);

          if (ASMJIT_UNLIKELY(commonData->hasAvx512B64() && size != 8))
            return DebugUtils::errored(kErrorInvalidBroadcast);
        }
      }

      // Validate AVX-512 {sae} and {er}.
      if (options & (X86Inst::kOptionSAE | X86Inst::kOptionER)) {
        // Rounding control is impossible if the instruction is not reg-to-reg.
        if (ASMJIT_UNLIKELY(memOp))
          return DebugUtils::errored(kErrorInvalidEROrSAE);

        // Check if {sae} or {er} is supported by the instruction.
        if (options & X86Inst::kOptionER) {
          // NOTE: if both {sae} and {er} are set, we don't care, as {sae} is implied.
          if (ASMJIT_UNLIKELY(!commonData->hasAvx512ER()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);

          // {er} is defined for scalar ops or vector ops using zmm (LL = 10). We
          // don't need any more bits in the instruction database to be able to
          // validate this, as each AVX512 instruction that has broadcast is vector
          // instruction (in this case we require zmm registers), otherwise it's a
          // scalar instruction, which is valid.
          if (commonData->hasAvx512B()) {
            // Supports broadcast, thus we require LL to be '10', which means there
            // have to be zmm registers used. We don't calculate LL here, but we know
            // that it would be '10' if there is at least one ZMM register used.

            // There is no 'ER' enabled instruction with less than two operands.
            ASMJIT_ASSERT(count >= 2);
            if (ASMJIT_UNLIKELY(!X86Reg::isZmm(operands[0]) && !X86Reg::isZmm(operands[1])))
              return DebugUtils::errored(kErrorInvalidEROrSAE);
          }
        }
        else {
          // {sae} doesn't have the same limitations as {er}, this is enough.
          if (ASMJIT_UNLIKELY(!commonData->hasAvx512SAE()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
      }
    }
    else {
      // Not AVX512 instruction - maybe OpExtra is xCX register used by REP/REPNZ prefix. Otherwise the instruction is invalid.
      if ((options & kAvx512Options) || (options & (X86Inst::kOptionRep | X86Inst::kOptionRepnz)) == 0)
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  return kErrorOk;
}